

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

ModuleRecordList * __thiscall Js::JavascriptLibrary::EnsureModuleRecordList(JavascriptLibrary *this)

{
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar1;
  Recycler *pRVar2;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  TrackAllocData local_38;
  JavascriptLibrary *local_10;
  JavascriptLibrary *this_local;
  
  local_10 = this;
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->moduleRecordList);
  if (*ppLVar1 ==
      (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    pRVar2 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)
               &JsUtil::
                List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x1c95);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_38);
    this_00 = (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::Recycler>(0x30,pRVar2,0x43c4b0);
    JsUtil::
    List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_00,this->recycler,4);
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::operator=(&this->moduleRecordList,this_00);
  }
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->moduleRecordList);
  return *ppLVar1;
}

Assistant:

ModuleRecordList* JavascriptLibrary::EnsureModuleRecordList()
    {
        if (moduleRecordList == nullptr)
        {
            moduleRecordList = RecyclerNew(recycler, ModuleRecordList, recycler);
        }
        return moduleRecordList;
    }